

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.h
# Opt level: O1

shared_ptr<hittable_list> box(point3 *a,point3 *b,shared_ptr<material> *mat)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  element_type *peVar5;
  hittable_list *phVar6;
  undefined8 *puVar7;
  shared_ptr<material> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  element_type *peVar11;
  shared_ptr<hittable_list> sVar12;
  vec3 dy;
  undefined1 local_191;
  quad *local_190;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_188;
  vec3 local_180;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_168;
  undefined8 uStack_160;
  element_type *local_158;
  undefined8 uStack_150;
  vec3 local_148;
  element_type *local_128;
  undefined8 uStack_120;
  vec3 local_118;
  vec3 local_100;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  shared_ptr<hittable> local_c0;
  shared_ptr<hittable> local_b0;
  shared_ptr<hittable> local_a0;
  shared_ptr<hittable> local_90;
  shared_ptr<hittable> local_80;
  shared_ptr<hittable> local_70;
  vec3 local_60;
  double local_48;
  undefined8 uStack_40;
  
  a->e[0] = 0.0;
  puVar7 = (undefined8 *)operator_new(0x60);
  puVar7[1] = 0x100000001;
  *puVar7 = &PTR___Sp_counted_ptr_inplace_0011f640;
  phVar6 = (hittable_list *)(puVar7 + 2);
  puVar7[2] = &PTR__hittable_list_0011f5d8;
  puVar7[3] = 0;
  puVar7[4] = 0;
  puVar7[5] = 0;
  puVar7[6] = 0x7ff0000000000000;
  puVar7[7] = 0xfff0000000000000;
  puVar7[8] = 0x7ff0000000000000;
  puVar7[9] = 0xfff0000000000000;
  puVar7[10] = 0x7ff0000000000000;
  puVar7[0xb] = 0xfff0000000000000;
  a->e[1] = (double)puVar7;
  a->e[0] = (double)phVar6;
  peVar11 = (element_type *)b->e[0];
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)b->e[1];
  peVar2 = (mat->super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_158 = peVar2;
  if ((double)peVar11 <= (double)peVar2) {
    local_158 = peVar11;
  }
  uStack_150 = 0;
  p_Var3 = (mat->super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  local_168 = p_Var3;
  if ((double)p_Var1 <= (double)p_Var3) {
    local_168 = p_Var1;
  }
  uStack_160 = 0;
  peVar4 = (element_type *)b->e[2];
  peVar5 = mat[1].super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_128 = peVar5;
  if ((double)peVar4 <= (double)peVar5) {
    local_128 = peVar4;
  }
  peVar9 = peVar2;
  if ((double)peVar2 <= (double)peVar11) {
    peVar9 = peVar11;
  }
  local_d8 = (double)(~-(ulong)NAN((double)peVar11) & (ulong)peVar9 |
                     -(ulong)NAN((double)peVar11) & (ulong)peVar2);
  p_Var10 = p_Var3;
  if ((double)p_Var3 <= (double)p_Var1) {
    p_Var10 = p_Var1;
  }
  local_48 = (double)(~-(ulong)NAN((double)p_Var1) & (ulong)p_Var10 |
                     -(ulong)NAN((double)p_Var1) & (ulong)p_Var3);
  peVar11 = peVar5;
  if ((double)peVar5 <= (double)peVar4) {
    peVar11 = peVar4;
  }
  local_118.e[2] =
       (double)(~-(ulong)NAN((double)peVar4) & (ulong)peVar11 |
               -(ulong)NAN((double)peVar4) & (ulong)peVar5);
  uStack_d0 = 0;
  local_100.e[0] = local_d8 - (double)local_158;
  local_100.e[1] = 0.0;
  local_100.e[2] = 0.0;
  uStack_40 = 0;
  local_60.e[1] = local_48 - (double)local_168;
  local_60.e[0] = 0.0;
  local_60.e[2] = 0.0;
  uStack_120 = 0;
  local_148.e[2] = local_118.e[2] - (double)local_128;
  local_148.e[0] = 0.0;
  local_148.e[1] = 0.0;
  local_118.e[0] = (double)local_158;
  local_118.e[1] = (double)local_168;
  uStack_e0 = 0;
  local_180.e[0] = 0.0;
  local_e8 = local_118.e[2];
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<quad,std::allocator<quad>,vec3,vec3&,vec3&,std::shared_ptr<material>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_180.e + 1),(quad **)&local_180,
             (allocator<quad> *)&local_190,&local_118,&local_100,&local_60,in_RCX);
  local_70.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_180.e[0];
  local_70.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180.e[1];
  local_180.e[0] = 0.0;
  local_180.e[1] = 0.0;
  hittable_list::add(phVar6,&local_70);
  if (local_70.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180.e[1]);
  }
  local_118.e[0] = local_d8;
  local_118.e[1] = (double)local_168;
  local_118.e[2] = local_e8;
  local_180.e[2] = -local_148.e[2];
  local_180.e[0] = -local_148.e[0];
  local_180.e[1] = -local_148.e[1];
  local_190 = (quad *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<quad,std::allocator<quad>,vec3,vec3,vec3&,std::shared_ptr<material>&>
            (&_Stack_188,&local_190,(allocator<quad> *)&local_191,&local_118,&local_180,&local_60,
             in_RCX);
  local_80.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_190->super_hittable;
  local_80.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_188._M_pi;
  local_190 = (quad *)0x0;
  _Stack_188._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  hittable_list::add(phVar6,&local_80);
  if (local_80.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_188._M_pi);
  }
  phVar6 = (hittable_list *)a->e[0];
  local_118.e[0] = local_d8;
  local_118.e[1] = (double)local_168;
  local_118.e[2] = (double)local_128;
  local_180.e[2] = -local_100.e[2];
  local_180.e[0] = -local_100.e[0];
  local_180.e[1] = (double)((ulong)local_100.e[1] ^ 0x8000000000000000);
  local_190 = (quad *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<quad,std::allocator<quad>,vec3,vec3,vec3&,std::shared_ptr<material>&>
            (&_Stack_188,&local_190,(allocator<quad> *)&local_191,&local_118,&local_180,&local_60,
             in_RCX);
  local_90.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_190->super_hittable;
  local_90.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_188._M_pi;
  local_190 = (quad *)0x0;
  _Stack_188._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  hittable_list::add(phVar6,&local_90);
  if (local_90.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_188._M_pi);
  }
  local_118.e[0] = (double)local_158;
  local_118.e[1] = (double)local_168;
  local_118.e[2] = (double)local_128;
  local_180.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<quad,std::allocator<quad>,vec3,vec3&,vec3&,std::shared_ptr<material>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_180.e + 1),(quad **)&local_180,
             (allocator<quad> *)&local_190,&local_118,&local_148,&local_60,in_RCX);
  local_a0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_180.e[0];
  local_a0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180.e[1];
  local_180.e[0] = 0.0;
  local_180.e[1] = 0.0;
  hittable_list::add(phVar6,&local_a0);
  if (local_a0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180.e[1]);
  }
  local_118.e[0] = (double)local_158;
  local_118.e[1] = local_48;
  local_118.e[2] = local_e8;
  local_180.e[2] = -local_148.e[2];
  local_180.e[0] = -local_148.e[0];
  local_180.e[1] = (double)((ulong)local_148.e[1] ^ 0x8000000000000000);
  local_190 = (quad *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<quad,std::allocator<quad>,vec3,vec3&,vec3,std::shared_ptr<material>&>
            (&_Stack_188,&local_190,(allocator<quad> *)&local_191,&local_118,&local_100,&local_180,
             in_RCX);
  local_b0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_190->super_hittable;
  local_b0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_188._M_pi;
  local_190 = (quad *)0x0;
  _Stack_188._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  hittable_list::add(phVar6,&local_b0);
  if (local_b0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_188._M_pi);
  }
  phVar6 = (hittable_list *)a->e[0];
  local_118.e[0] = (double)local_158;
  local_118.e[1] = (double)local_168;
  local_118.e[2] = (double)local_128;
  local_180.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<quad,std::allocator<quad>,vec3,vec3&,vec3&,std::shared_ptr<material>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_180.e + 1),(quad **)&local_180,
             (allocator<quad> *)&local_190,&local_118,&local_100,&local_148,in_RCX);
  local_c0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_180.e[0];
  local_c0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180.e[1];
  local_180.e[0] = 0.0;
  local_180.e[1] = 0.0;
  hittable_list::add(phVar6,&local_c0);
  _Var8._M_pi = extraout_RDX;
  if (local_c0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var8._M_pi = extraout_RDX_00;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180.e[1]);
    _Var8._M_pi = extraout_RDX_01;
  }
  sVar12.super___shared_ptr<hittable_list,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  sVar12.super___shared_ptr<hittable_list,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)a;
  return (shared_ptr<hittable_list>)
         sVar12.super___shared_ptr<hittable_list,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline shared_ptr<hittable_list> box(const point3& a, const point3& b, shared_ptr<material> mat)
{
    // Returns the 3D box (six sides) that contains the two opposite vertices a & b.

    auto sides = make_shared<hittable_list>();

    // Construct the two opposite vertices with the minimum and maximum coordinates.
    auto min = point3(std::fmin(a.x(),b.x()), std::fmin(a.y(),b.y()), std::fmin(a.z(),b.z()));
    auto max = point3(std::fmax(a.x(),b.x()), std::fmax(a.y(),b.y()), std::fmax(a.z(),b.z()));

    auto dx = vec3(max.x() - min.x(), 0, 0);
    auto dy = vec3(0, max.y() - min.y(), 0);
    auto dz = vec3(0, 0, max.z() - min.z());

    sides->add(make_shared<quad>(point3(min.x(), min.y(), max.z()),  dx,  dy, mat)); // front
    sides->add(make_shared<quad>(point3(max.x(), min.y(), max.z()), -dz,  dy, mat)); // right
    sides->add(make_shared<quad>(point3(max.x(), min.y(), min.z()), -dx,  dy, mat)); // back
    sides->add(make_shared<quad>(point3(min.x(), min.y(), min.z()),  dz,  dy, mat)); // left
    sides->add(make_shared<quad>(point3(min.x(), max.y(), max.z()),  dx, -dz, mat)); // top
    sides->add(make_shared<quad>(point3(min.x(), min.y(), min.z()),  dx,  dz, mat)); // bottom

    return sides;
}